

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::with_statement::~with_statement(with_statement *this)

{
  with_statement *this_local;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__with_statement_002a1818;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->s_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->e_);
  statement::~statement(&this->super_statement);
  return;
}

Assistant:

explicit with_statement(const source_extend& extend, expression_ptr&& e, statement_ptr&& s) : statement(extend), e_(std::move(e)), s_(std::move(s)) {
        assert(e_);
        assert(s_);
    }